

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O2

FieldBase * __thiscall FIX::FieldMap::getFieldRef(FieldMap *this,int tag)

{
  const_iterator cVar1;
  FieldNotFound *this_00;
  allocator<char> local_41;
  string local_40;
  
  cVar1 = findTag(this,tag);
  if (cVar1._M_current != *(FieldBase **)(this + 0x10)) {
    return cVar1._M_current;
  }
  this_00 = (FieldNotFound *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  FieldNotFound::FieldNotFound(this_00,tag,&local_40);
  __cxa_throw(this_00,&FieldNotFound::typeinfo,Exception::~Exception);
}

Assistant:

const FieldBase& getFieldRef( int tag )
  const EXCEPT ( FieldNotFound )
  {
    Fields::const_iterator iter = findTag( tag );
    if ( iter == m_fields.end() )
      throw FieldNotFound( tag );
    return (*iter);
  }